

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_iso9660.c
# Opt level: O2

int iso9660AddEntry(PHYSFS_Io *io,int joliet,int isdir,char *base,PHYSFS_uint8 *fname,int fnamelen,
                   PHYSFS_sint64 ts,PHYSFS_uint64 pos,PHYSFS_uint64 len,void *unpkarc)

{
  undefined8 uVar1;
  size_t __maxlen;
  PHYSFS_Io *io_00;
  int isdir_00;
  PHYSFS_uint16 PVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  void *pvVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 *puVar10;
  undefined8 *puVar11;
  size_t len_00;
  undefined1 *ptr;
  PHYSFS_uint16 *ucs2;
  PHYSFS_uint64 len_01;
  undefined1 auStack_58 [8];
  size_t local_50;
  PHYSFS_Io *local_48;
  char *local_40;
  int local_38;
  int local_34;
  
  puVar10 = auStack_58;
  if (fnamelen == 0) {
LAB_001181a3:
    puVar11 = (undefined8 *)(puVar10 + -8);
    *(undefined8 *)(puVar10 + -8) = 0x12;
  }
  else {
    if ((fnamelen == 1) && (*fname < 2)) {
      return 1;
    }
    if (joliet == 0) {
      iVar3 = 1;
    }
    else {
      puVar10 = auStack_58;
      if ((fnamelen & 1U) != 0) goto LAB_001181a3;
      iVar3 = 2;
    }
    puVar10 = auStack_58;
    local_48 = io;
    local_38 = joliet;
    local_34 = isdir;
    sVar4 = strlen(base);
    uVar9 = (ulong)(uint)(iVar3 * fnamelen);
    len_00 = sVar4 + uVar9 + 2;
    if (len_00 < 0x100) {
      puVar10 = auStack_58 + -(sVar4 + uVar9 + 0x19 & 0xfffffffffffffff0);
      ptr = puVar10;
    }
    else {
      ptr = (undefined1 *)0x0;
    }
    local_50 = len_00;
    *(undefined8 *)(puVar10 + -8) = 0x118083;
    pcVar5 = (char *)__PHYSFS_initSmallAlloc(ptr,len_00);
    __maxlen = local_50;
    local_40 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      len_01 = local_50;
      if (sVar4 != 0) {
        *(undefined8 *)(puVar10 + -8) = 0x1180aa;
        snprintf(pcVar5,__maxlen,"%s/",base);
        pcVar5 = local_40 + sVar4 + 1;
        len_01 = uVar9 + 3;
      }
      if (local_38 == 0) {
        uVar9 = 0;
        uVar8 = 0;
        if (0 < fnamelen) {
          uVar8 = (ulong)(uint)fnamelen;
        }
        for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          if ((char)fname[uVar9] < '\0') goto LAB_001181a3;
          pcVar5[uVar9] = fname[uVar9];
        }
        pcVar5[(uint)fnamelen] = '\0';
        if (local_34 == 0) {
          *(undefined8 *)(puVar10 + -8) = 0x3b;
          uVar1 = *(undefined8 *)(puVar10 + -8);
          *(undefined8 *)(puVar10 + -8) = 0x1181d9;
          pcVar7 = strrchr(pcVar5,(int)uVar1);
          if (pcVar7 == pcVar5 || pcVar7 == (char *)0x0) {
            pcVar5 = pcVar5 + (fnamelen - 1);
          }
          else {
            pcVar5 = pcVar7 + -1;
            *pcVar7 = '\0';
          }
          if (*pcVar5 == '.') {
            *pcVar5 = '\0';
          }
        }
      }
      else {
        for (uVar9 = 0; (uint)fnamelen >> 1 != uVar9; uVar9 = uVar9 + 1) {
          PVar2 = *(PHYSFS_uint16 *)(fname + uVar9 * 2);
          *(undefined8 *)(puVar10 + -8) = 0x1180ec;
          PVar2 = PHYSFS_swapUBE16(PVar2);
          *(PHYSFS_uint16 *)(fname + uVar9 * 2) = PVar2;
        }
        (fname + (ulong)((uint)fnamelen >> 1) * 2)[0] = '\0';
        (fname + (ulong)((uint)fnamelen >> 1) * 2)[1] = '\0';
        *(undefined8 *)(puVar10 + -8) = 0x11810a;
        PHYSFS_utf8FromUcs2((PHYSFS_uint16 *)fname,pcVar5,len_01);
      }
      isdir_00 = local_34;
      pcVar5 = local_40;
      *(PHYSFS_uint64 *)(puVar10 + -0x10) = len;
      *(undefined8 *)(puVar10 + -0x18) = 0x118139;
      pvVar6 = UNPK_addEntry(unpkarc,pcVar5,isdir_00,ts,ts,pos,*(PHYSFS_uint64 *)(puVar10 + -0x10));
      iVar3 = local_38;
      pcVar5 = local_40;
      io_00 = local_48;
      if ((isdir_00 != 0) && (pvVar6 != (void *)0x0)) {
        *(undefined8 *)(puVar10 + -8) = 0x118164;
        iVar3 = iso9660LoadEntries(io_00,iVar3,pcVar5,pos,len + pos,unpkarc);
        if (iVar3 == 0) {
          pvVar6 = (void *)0x0;
        }
      }
      pcVar5 = local_40;
      *(undefined8 *)(puVar10 + -8) = 0x118175;
      __PHYSFS_smallFree(pcVar5);
      return (uint)(pvVar6 != (void *)0x0);
    }
    puVar11 = (undefined8 *)(puVar10 + -8);
    *(undefined8 *)(puVar10 + -8) = 2;
  }
  uVar1 = *puVar11;
  *puVar11 = 0x1181ab;
  PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar1);
  return 0;
}

Assistant:

static int iso9660AddEntry(PHYSFS_Io *io, const int joliet, const int isdir,
                           const char *base, PHYSFS_uint8 *fname,
                           const int fnamelen, const PHYSFS_sint64 ts,
                           const PHYSFS_uint64 pos, const PHYSFS_uint64 len,
                           void *unpkarc)
{
    char *fullpath;
    char *fnamecpy;
    size_t baselen;
    size_t fullpathlen;
    void *entry;
    int i;

    if (fnamelen == 1 && ((fname[0] == 0) || (fname[0] == 1)))
        return 1;  /* Magic that represents "." and "..", ignore */

    BAIL_IF(fnamelen == 0, PHYSFS_ERR_CORRUPT, 0);
    assert(fnamelen > 0);
    assert(fnamelen <= 255);
    BAIL_IF(joliet && (fnamelen % 2), PHYSFS_ERR_CORRUPT, 0);

    /* Joliet is UCS-2, so at most UTF-8 will double the byte size */
    baselen = strlen(base);
    fullpathlen = baselen + (fnamelen * (joliet ? 2 : 1)) + 2;
    fullpath = (char *) __PHYSFS_smallAlloc(fullpathlen);
    BAIL_IF(!fullpath, PHYSFS_ERR_OUT_OF_MEMORY, 0);
    fnamecpy = fullpath;
    if (baselen > 0)
    {
        snprintf(fullpath, fullpathlen, "%s/", base);
        fnamecpy += baselen + 1;
        fullpathlen -= baselen - 1;
    } /* if */

    if (joliet)
    {
        PHYSFS_uint16 *ucs2 = (PHYSFS_uint16 *) fname;
        int total = fnamelen / 2;
        for (i = 0; i < total; i++)
            ucs2[i] = PHYSFS_swapUBE16(ucs2[i]);
        ucs2[total] = '\0';
        PHYSFS_utf8FromUcs2(ucs2, fnamecpy, fullpathlen);
    } /* if */
    else
    {
        for (i = 0; i < fnamelen; i++)
        {
            /* We assume the filenames are low-ASCII; consider the archive
               corrupt if we see something above 127, since we don't know the
               encoding. (We can change this later if we find out these exist
               and are intended to be, say, latin-1 or UTF-8 encoding). */
            BAIL_IF(fname[i] > 127, PHYSFS_ERR_CORRUPT, 0);
            fnamecpy[i] = fname[i];
        } /* for */
        fnamecpy[fnamelen] = '\0';

        if (!isdir)
        {
            /* find last SEPARATOR2 */
            char *ptr = strrchr(fnamecpy, ';');
            if (ptr && (ptr != fnamecpy))
                *(ptr--) = '\0';
            else
                ptr = fnamecpy + (fnamelen - 1);

            /* chop out any trailing '.', as done in all implementations */
            if (*ptr == '.')
                *ptr = '\0';
        } /* if */
    } /* else */

    entry = UNPK_addEntry(unpkarc, fullpath, isdir, ts, ts, pos, len);
    if ((entry) && (isdir))
    {
        if (!iso9660LoadEntries(io, joliet, fullpath, pos, pos + len, unpkarc))
            entry = NULL;  /* so we report a failure later. */
    } /* if */

    __PHYSFS_smallFree(fullpath);
    return entry != NULL;
}